

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void transaction_test(void)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  fdb_file_handle *in_stack_fffffffffffff958;
  undefined7 in_stack_fffffffffffff960;
  fdb_isolation_level_t in_stack_fffffffffffff967;
  fdb_file_handle *in_stack_fffffffffffff968;
  fdb_commit_opt_t in_stack_fffffffffffff977;
  fdb_file_handle *in_stack_fffffffffffff978;
  size_t in_stack_fffffffffffff980;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_doc *pfStack_b8;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *db_txn3;
  fdb_kvs_handle *db_txn2;
  fdb_kvs_handle *db_txn1;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile_txn3;
  fdb_file_handle *dbfile_txn2;
  fdb_file_handle *dbfile_txn1;
  fdb_file_handle *dbfile;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.wal_threshold._4_4_ = 0;
  fconfig.flags._3_1_ = 0;
  fdb_open((fdb_file_handle **)fconfig._64_8_,(char *)fconfig.compactor_sleep_duration,
           (fdb_config *)fconfig.compaction_minimum_filesize);
  fdb_kvs_open_default
            ((fdb_file_handle *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
             &in_stack_fffffffffffff958->root,(fdb_kvs_config *)0x116092);
  fVar1 = fdb_set_log_callback(db_txn1,logCallbackFunc,"transaction_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xbf3);
    transaction_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xbf3,"void transaction_test()");
    }
  }
  fdb_open((fdb_file_handle **)fconfig._64_8_,(char *)fconfig.compactor_sleep_duration,
           (fdb_config *)fconfig.compaction_minimum_filesize);
  fdb_open((fdb_file_handle **)fconfig._64_8_,(char *)fconfig.compactor_sleep_duration,
           (fdb_config *)fconfig.compaction_minimum_filesize);
  fdb_kvs_open_default
            ((fdb_file_handle *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
             &in_stack_fffffffffffff958->root,(fdb_kvs_config *)0x11615a);
  fdb_kvs_open_default
            ((fdb_file_handle *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
             &in_stack_fffffffffffff958->root,(fdb_kvs_config *)0x116171);
  fdb_begin_transaction(in_stack_fffffffffffff968,in_stack_fffffffffffff967);
  fdb_begin_transaction(in_stack_fffffffffffff968,in_stack_fffffffffffff967);
  for (n = 0; n < 5; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar4 = (void *)0x116275;
    sVar3 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff968,
                   (void *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                   (size_t)in_stack_fffffffffffff958,pvVar4,sVar3,(void *)0x1162ac,
                   in_stack_fffffffffffff980);
    fdb_set(db_txn2,*(fdb_doc **)(&stack0xfffffffffffff958 + (long)n * 8));
  }
  for (n = 5; n < 10; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar4 = (void *)0x1163b0;
    sVar3 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff968,
                   (void *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                   (size_t)in_stack_fffffffffffff958,pvVar4,sVar3,(void *)0x1163e7,
                   in_stack_fffffffffffff980);
    fdb_set(db_txn3,*(fdb_doc **)(&stack0xfffffffffffff958 + (long)n * 8));
  }
  for (n = 0; n < 10; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    pvVar4 = (void *)0x116459;
    strlen(metabuf + 0xf8);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff968,
                   (void *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                   (size_t)in_stack_fffffffffffff958,pvVar4,0,(void *)0x116486,
                   in_stack_fffffffffffff980);
    fVar1 = fdb_get(db_txn2,pfStack_b8);
    if (n < 5) {
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xc1a);
        transaction_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xc1a,"void transaction_test()");
        }
      }
    }
    else if (fVar1 == FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xc1c);
      transaction_test::__test_pass = 0;
      __assert_fail("status != FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xc1c,"void transaction_test()");
    }
    fdb_doc_free((fdb_doc *)0x116599);
  }
  fdb_open((fdb_file_handle **)fconfig._64_8_,(char *)fconfig.compactor_sleep_duration,
           (fdb_config *)fconfig.compaction_minimum_filesize);
  fdb_kvs_open_default
            ((fdb_file_handle *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
             &in_stack_fffffffffffff958->root,(fdb_kvs_config *)0x1165d5);
  fdb_begin_transaction(in_stack_fffffffffffff968,in_stack_fffffffffffff967);
  for (n = 0; n < 10; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    pvVar4 = (void *)0x116628;
    strlen(metabuf + 0xf8);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff968,
                   (void *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                   (size_t)in_stack_fffffffffffff958,pvVar4,0,(void *)0x116655,
                   in_stack_fffffffffffff980);
    fVar1 = fdb_get((fdb_kvs_handle *)doc,pfStack_b8);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xc29);
      transaction_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xc29,"void transaction_test()");
      }
    }
    fdb_doc_free((fdb_doc *)0x1166e1);
  }
  fdb_end_transaction(in_stack_fffffffffffff978,in_stack_fffffffffffff977);
  fdb_close(in_stack_fffffffffffff958);
  fdb_end_transaction(in_stack_fffffffffffff978,in_stack_fffffffffffff977);
  for (n = 0; n < 10; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    pvVar4 = (void *)0x116753;
    strlen(metabuf + 0xf8);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff968,
                   (void *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                   (size_t)in_stack_fffffffffffff958,pvVar4,0,(void *)0x116780,
                   in_stack_fffffffffffff980);
    fVar1 = fdb_get(db_txn1,pfStack_b8);
    if (n < 5) {
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xc38);
        transaction_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xc38,"void transaction_test()");
        }
      }
    }
    else if (fVar1 == FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xc3a);
      transaction_test::__test_pass = 0;
      __assert_fail("status != FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xc3a,"void transaction_test()");
    }
    fdb_doc_free((fdb_doc *)0x116893);
  }
  for (n = 0; n < 10; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    pvVar4 = (void *)0x1168e6;
    strlen(metabuf + 0xf8);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff968,
                   (void *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                   (size_t)in_stack_fffffffffffff958,pvVar4,0,(void *)0x116913,
                   in_stack_fffffffffffff980);
    fVar1 = fdb_get(db_txn3,pfStack_b8);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xc44);
      transaction_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xc44,"void transaction_test()");
      }
    }
    fdb_doc_free((fdb_doc *)0x11699f);
  }
  fdb_abort_transaction(in_stack_fffffffffffff958);
  fdb_close(in_stack_fffffffffffff958);
  fdb_open((fdb_file_handle **)fconfig._64_8_,(char *)fconfig.compactor_sleep_duration,
           (fdb_config *)fconfig.compaction_minimum_filesize);
  fdb_kvs_open_default
            ((fdb_file_handle *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
             &in_stack_fffffffffffff958->root,(fdb_kvs_config *)0x1169ed);
  fVar1 = fdb_set_log_callback(db_txn1,logCallbackFunc,"transaction_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xc51);
    transaction_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xc51,"void transaction_test()");
    }
  }
  for (n = 0; n < 10; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    pvVar4 = (void *)0x116ab5;
    strlen(metabuf + 0xf8);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff968,
                   (void *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                   (size_t)in_stack_fffffffffffff958,pvVar4,0,(void *)0x116ae2,
                   in_stack_fffffffffffff980);
    fVar1 = fdb_get(db_txn1,pfStack_b8);
    if (n < 5) {
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xc59);
        transaction_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xc59,"void transaction_test()");
        }
      }
    }
    else if (fVar1 == FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xc5b);
      transaction_test::__test_pass = 0;
      __assert_fail("status != FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xc5b,"void transaction_test()");
    }
    fdb_doc_free((fdb_doc *)0x116bf5);
  }
  for (n = 5; n < 10; n = n + 1) {
    fdb_set(db_txn1,*(fdb_doc **)(&stack0xfffffffffffff958 + (long)n * 8));
  }
  fdb_commit(in_stack_fffffffffffff958,'\0');
  for (n = 0; n < 10; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    pvVar4 = (void *)0x116c8f;
    strlen(metabuf + 0xf8);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff968,
                   (void *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                   (size_t)in_stack_fffffffffffff958,pvVar4,0,(void *)0x116cbc,
                   in_stack_fffffffffffff980);
    fVar1 = fdb_get(db_txn1,pfStack_b8);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xc6b);
      transaction_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xc6b,"void transaction_test()");
      }
    }
    fdb_doc_free((fdb_doc *)0x116d48);
  }
  fdb_begin_transaction(in_stack_fffffffffffff968,in_stack_fffffffffffff967);
  fdb_begin_transaction(in_stack_fffffffffffff968,in_stack_fffffffffffff967);
  for (n = 0; n < 10; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d_txn1",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar4 = (void *)0x116e29;
    sVar3 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff968,
                   (void *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                   (size_t)in_stack_fffffffffffff958,pvVar4,sVar3,(void *)0x116e60,
                   in_stack_fffffffffffff980);
    fdb_set(db_txn2,pfStack_b8);
    fdb_doc_free((fdb_doc *)0x116e83);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d_txn2",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar4 = (void *)0x116ef7;
    sVar3 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff968,
                   (void *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                   (size_t)in_stack_fffffffffffff958,pvVar4,sVar3,(void *)0x116f2e,
                   in_stack_fffffffffffff980);
    fdb_set(db_txn3,pfStack_b8);
    fdb_doc_free((fdb_doc *)0x116f51);
  }
  n = 0;
  while( true ) {
    if (9 < n) {
      fdb_end_transaction(in_stack_fffffffffffff978,in_stack_fffffffffffff977);
      n = 0;
      while( true ) {
        if (9 < n) {
          fdb_end_transaction(in_stack_fffffffffffff978,in_stack_fffffffffffff977);
          for (n = 0; n < 10; n = n + 1) {
            sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
            pvVar4 = (void *)0x117766;
            strlen(metabuf + 0xf8);
            fdb_doc_create((fdb_doc **)in_stack_fffffffffffff968,
                           (void *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                           (size_t)in_stack_fffffffffffff958,pvVar4,0,(void *)0x117793,
                           in_stack_fffffffffffff980);
            fVar1 = fdb_get(db_txn1,pfStack_b8);
            if (fVar1 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xcbd);
              transaction_test::__test_pass = 0;
              if (fVar1 != FDB_RESULT_SUCCESS) {
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                              ,0xcbd,"void transaction_test()");
              }
            }
            sprintf((char *)&fconfig.num_blocks_readahead,"body%d_txn1",(ulong)(uint)n);
            iVar2 = memcmp(pfStack_b8->body,&fconfig.num_blocks_readahead,pfStack_b8->bodylen);
            if (iVar2 != 0) {
              fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                      &fconfig.num_blocks_readahead,pfStack_b8->body,
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xcbf);
              transaction_test::__test_pass = 0;
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0xcbf,"void transaction_test()");
            }
            fdb_doc_free((fdb_doc *)0x1178be);
          }
          fdb_begin_transaction(in_stack_fffffffffffff968,in_stack_fffffffffffff967);
          sprintf(metabuf + 0xf8,"key%d",5);
          sprintf(bodybuf + 0xf8,"meta%d",5);
          sprintf((char *)&fconfig.num_blocks_readahead,"body%d_before_compaction",5);
          strlen(metabuf + 0xf8);
          strlen(bodybuf + 0xf8);
          pvVar4 = (void *)0x117985;
          sVar3 = strlen((char *)&fconfig.num_blocks_readahead);
          fdb_doc_create((fdb_doc **)in_stack_fffffffffffff968,
                         (void *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                         (size_t)in_stack_fffffffffffff958,pvVar4,sVar3,(void *)0x1179bc,
                         in_stack_fffffffffffff980);
          fdb_set(db_txn2,pfStack_b8);
          fdb_doc_free((fdb_doc *)0x1179df);
          fdb_compact((fdb_file_handle *)
                      CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                      (char *)in_stack_fffffffffffff958);
          pvVar4 = (void *)0x117a09;
          strlen(metabuf + 0xf8);
          fdb_doc_create((fdb_doc **)in_stack_fffffffffffff968,
                         (void *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                         (size_t)in_stack_fffffffffffff958,pvVar4,0,(void *)0x117a36,
                         in_stack_fffffffffffff980);
          fVar1 = fdb_get(db_txn2,pfStack_b8);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xcd7);
            transaction_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0xcd7,"void transaction_test()");
            }
          }
          iVar2 = memcmp(pfStack_b8->body,&fconfig.num_blocks_readahead,pfStack_b8->bodylen);
          if (iVar2 == 0) {
            fdb_doc_free((fdb_doc *)0x117b49);
            pvVar4 = (void *)0x117b63;
            strlen(metabuf + 0xf8);
            fdb_doc_create((fdb_doc **)in_stack_fffffffffffff968,
                           (void *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                           (size_t)in_stack_fffffffffffff958,pvVar4,0,(void *)0x117b90,
                           in_stack_fffffffffffff980);
            fVar1 = fdb_get(db_txn1,pfStack_b8);
            if (fVar1 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xcde);
              transaction_test::__test_pass = 0;
              if (fVar1 != FDB_RESULT_SUCCESS) {
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                              ,0xcde,"void transaction_test()");
              }
            }
            sprintf((char *)&fconfig.num_blocks_readahead,"body%d_txn1",5);
            iVar2 = memcmp(pfStack_b8->body,&fconfig.num_blocks_readahead,pfStack_b8->bodylen);
            if (iVar2 == 0) {
              fdb_doc_free((fdb_doc *)0x117cbb);
              fdb_end_transaction(in_stack_fffffffffffff978,in_stack_fffffffffffff977);
              n = 0;
              while( true ) {
                if (9 < n) {
                  fdb_close(in_stack_fffffffffffff958);
                  fdb_open((fdb_file_handle **)fconfig._64_8_,
                           (char *)fconfig.compactor_sleep_duration,
                           (fdb_config *)fconfig.compaction_minimum_filesize);
                  fdb_kvs_open_default
                            ((fdb_file_handle *)
                             CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                             &in_stack_fffffffffffff958->root,(fdb_kvs_config *)0x117ec8);
                  fVar1 = fdb_set_log_callback(db_txn1,logCallbackFunc,"transaction_test");
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    fprintf(_stderr,"Test failed: %s %d\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0xcfb);
                    transaction_test::__test_pass = 0;
                    if (fVar1 != FDB_RESULT_SUCCESS) {
                      __assert_fail("status == FDB_RESULT_SUCCESS",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                                    ,0xcfb,"void transaction_test()");
                    }
                  }
                  n = 0;
                  while( true ) {
                    if (9 < n) {
                      fdb_close(in_stack_fffffffffffff958);
                      fdb_close(in_stack_fffffffffffff958);
                      fdb_close(in_stack_fffffffffffff958);
                      for (n = 0; n < 10; n = n + 1) {
                        fdb_doc_free((fdb_doc *)0x118154);
                      }
                      fdb_shutdown();
                      memleak_end();
                      if (transaction_test::__test_pass == 0) {
                        fprintf(_stderr,"%s FAILED\n","transaction test");
                      }
                      else {
                        fprintf(_stderr,"%s PASSED\n","transaction test");
                      }
                      return;
                    }
                    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
                    pvVar4 = (void *)0x117f90;
                    strlen(metabuf + 0xf8);
                    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff968,
                                   (void *)CONCAT17(in_stack_fffffffffffff967,
                                                    in_stack_fffffffffffff960),
                                   (size_t)in_stack_fffffffffffff958,pvVar4,0,(void *)0x117fbd,
                                   in_stack_fffffffffffff980);
                    fVar1 = fdb_get(db_txn1,pfStack_b8);
                    if (fVar1 != FDB_RESULT_SUCCESS) {
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                              ,0xd02);
                      transaction_test::__test_pass = 0;
                      if (fVar1 != FDB_RESULT_SUCCESS) {
                        __assert_fail("status == FDB_RESULT_SUCCESS",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                                      ,0xd02,"void transaction_test()");
                      }
                    }
                    if (n == 5) {
                      sprintf((char *)&fconfig.num_blocks_readahead,"body%d_before_compaction",5);
                    }
                    else {
                      sprintf((char *)&fconfig.num_blocks_readahead,"body%d_txn1",(ulong)(uint)n);
                    }
                    iVar2 = memcmp(pfStack_b8->body,&fconfig.num_blocks_readahead,
                                   pfStack_b8->bodylen);
                    if (iVar2 != 0) break;
                    fdb_doc_free((fdb_doc *)0x118108);
                    n = n + 1;
                  }
                  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                          &fconfig.num_blocks_readahead,pfStack_b8->body,
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xd08);
                  transaction_test::__test_pass = 0;
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                                ,0xd08,"void transaction_test()");
                }
                sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
                pvVar4 = (void *)0x117d0b;
                strlen(metabuf + 0xf8);
                fdb_doc_create((fdb_doc **)in_stack_fffffffffffff968,
                               (void *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960)
                               ,(size_t)in_stack_fffffffffffff958,pvVar4,0,(void *)0x117d38,
                               in_stack_fffffffffffff980);
                fVar1 = fdb_get(db_txn1,pfStack_b8);
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xceb);
                  transaction_test::__test_pass = 0;
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    __assert_fail("status == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                                  ,0xceb,"void transaction_test()");
                  }
                }
                if (n == 5) {
                  sprintf((char *)&fconfig.num_blocks_readahead,"body%d_before_compaction",5);
                }
                else {
                  sprintf((char *)&fconfig.num_blocks_readahead,"body%d_txn1",(ulong)(uint)n);
                }
                iVar2 = memcmp(pfStack_b8->body,&fconfig.num_blocks_readahead,pfStack_b8->bodylen);
                if (iVar2 != 0) break;
                fdb_doc_free((fdb_doc *)0x117e83);
                n = n + 1;
              }
              fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                      &fconfig.num_blocks_readahead,pfStack_b8->body,
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xcf1);
              transaction_test::__test_pass = 0;
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0xcf1,"void transaction_test()");
            }
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                    &fconfig.num_blocks_readahead,pfStack_b8->body,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xce0);
            transaction_test::__test_pass = 0;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xce0,"void transaction_test()");
          }
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                  &fconfig.num_blocks_readahead,pfStack_b8->body,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xcd8);
          transaction_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xcd8,"void transaction_test()");
        }
        sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
        pvVar4 = (void *)0x11743e;
        strlen(metabuf + 0xf8);
        fdb_doc_create((fdb_doc **)in_stack_fffffffffffff968,
                       (void *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                       (size_t)in_stack_fffffffffffff958,pvVar4,0,(void *)0x11746b,
                       in_stack_fffffffffffff980);
        fVar1 = fdb_get(db_txn1,pfStack_b8);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xca8);
          transaction_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xca8,"void transaction_test()");
          }
        }
        sprintf((char *)&fconfig.num_blocks_readahead,"body%d_txn2",(ulong)(uint)n);
        iVar2 = memcmp(pfStack_b8->body,&fconfig.num_blocks_readahead,pfStack_b8->bodylen);
        if (iVar2 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                  &fconfig.num_blocks_readahead,pfStack_b8->body,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xcaa);
          transaction_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xcaa,"void transaction_test()");
        }
        fdb_doc_free((fdb_doc *)0x117596);
        pvVar4 = (void *)0x1175b0;
        strlen(metabuf + 0xf8);
        fdb_doc_create((fdb_doc **)in_stack_fffffffffffff968,
                       (void *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                       (size_t)in_stack_fffffffffffff958,pvVar4,0,(void *)0x1175dd,
                       in_stack_fffffffffffff980);
        fVar1 = fdb_get(db_txn2,pfStack_b8);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xcb0);
          transaction_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xcb0,"void transaction_test()");
          }
        }
        sprintf((char *)&fconfig.num_blocks_readahead,"body%d_txn1",(ulong)(uint)n);
        iVar2 = memcmp(pfStack_b8->body,&fconfig.num_blocks_readahead,pfStack_b8->bodylen);
        if (iVar2 != 0) break;
        fdb_doc_free((fdb_doc *)0x117708);
        n = n + 1;
      }
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",&fconfig.num_blocks_readahead,
              pfStack_b8->body,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xcb2);
      transaction_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xcb2,"void transaction_test()");
    }
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    pvVar4 = (void *)0x116fa4;
    strlen(metabuf + 0xf8);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff968,
                   (void *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                   (size_t)in_stack_fffffffffffff958,pvVar4,0,(void *)0x116fd1,
                   in_stack_fffffffffffff980);
    fVar1 = fdb_get(db_txn1,pfStack_b8);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xc8c);
      transaction_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xc8c,"void transaction_test()");
      }
    }
    iVar2 = memcmp(pfStack_b8->body,
                   *(void **)(*(long *)(&stack0xfffffffffffff958 + (long)n * 8) + 0x40),
                   pfStack_b8->bodylen);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)(*(long *)(&stack0xfffffffffffff958 + (long)n * 8) + 0x40),
              pfStack_b8->body,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xc8d);
      transaction_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xc8d,"void transaction_test()");
    }
    fdb_doc_free((fdb_doc *)0x1170fc);
    pvVar4 = (void *)0x117116;
    strlen(metabuf + 0xf8);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff968,
                   (void *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                   (size_t)in_stack_fffffffffffff958,pvVar4,0,(void *)0x117143,
                   in_stack_fffffffffffff980);
    fVar1 = fdb_get(db_txn2,pfStack_b8);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xc93);
      transaction_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xc93,"void transaction_test()");
      }
    }
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d_txn1",(ulong)(uint)n);
    iVar2 = memcmp(pfStack_b8->body,&fconfig.num_blocks_readahead,pfStack_b8->bodylen);
    if (iVar2 != 0) break;
    fdb_doc_free((fdb_doc *)0x11726e);
    pvVar4 = (void *)0x117288;
    strlen(metabuf + 0xf8);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff968,
                   (void *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                   (size_t)in_stack_fffffffffffff958,pvVar4,0,(void *)0x1172b5,
                   in_stack_fffffffffffff980);
    fVar1 = fdb_get(db_txn3,pfStack_b8);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xc9b);
      transaction_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xc9b,"void transaction_test()");
      }
    }
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d_txn2",(ulong)(uint)n);
    iVar2 = memcmp(pfStack_b8->body,&fconfig.num_blocks_readahead,pfStack_b8->bodylen);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",&fconfig.num_blocks_readahead,
              pfStack_b8->body,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xc9d);
      transaction_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xc9d,"void transaction_test()");
    }
    fdb_doc_free((fdb_doc *)0x1173e0);
    n = n + 1;
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",&fconfig.num_blocks_readahead,
          pfStack_b8->body,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0xc95);
  transaction_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xc95,"void transaction_test()");
}

Assistant:

void transaction_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile, *dbfile_txn1, *dbfile_txn2, *dbfile_txn3;
    fdb_kvs_handle *db, *db_txn1, *db_txn2, *db_txn3;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "transaction_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // open db and begin transactions
    fdb_open(&dbfile_txn1, "mvcc_test1", &fconfig);
    fdb_open(&dbfile_txn2, "mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);
    fdb_kvs_open_default(dbfile_txn2, &db_txn2, &kvs_config);
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    fdb_begin_transaction(dbfile_txn2, FDB_ISOLATION_READ_COMMITTED);

    // insert half docs into txn1
    for (i=0;i<n/2;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        fdb_set(db_txn1, doc[i]);
    }

    // insert other half docs into txn2
    for (i=n/2;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        fdb_set(db_txn2, doc[i]);
    }

    // uncommitted docs should not be read by the other transaction that
    // doesn't allow uncommitted reads.
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn1, rdoc);
        if (i<n/2) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
    }

    // uncommitted docs can be read by the transaction that allows uncommitted reads.
    fdb_open(&dbfile_txn3, "mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile_txn3, &db_txn3, &kvs_config);
    fdb_begin_transaction(dbfile_txn3, FDB_ISOLATION_READ_UNCOMMITTED);
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn3, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
    }
    fdb_end_transaction(dbfile_txn3, FDB_COMMIT_NORMAL);
    fdb_close(dbfile_txn3);

    // commit and end txn1
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_NORMAL);

    // uncommitted docs should not be read generally
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (i<n/2) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
    }

    // read uncommitted docs using the same transaction
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn2, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
    }

    // abort txn2
    fdb_abort_transaction(dbfile_txn2);

    // close & re-open db file
    fdb_close(dbfile);
    fdb_open(&dbfile, "mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "transaction_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // uncommitted docs should not be read after reopening the file either
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (i<n/2) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
    }

    // insert other half docs & commit
    for (i=n/2;i<n;++i){
        fdb_set(db, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // now all docs can be read generally
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
    }

    // begin transactions
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    fdb_begin_transaction(dbfile_txn2, FDB_ISOLATION_READ_COMMITTED);

    // concurrently update docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d_txn1", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        fdb_set(db_txn1, rdoc);
        fdb_doc_free(rdoc);

        sprintf(bodybuf, "body%d_txn2", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        fdb_set(db_txn2, rdoc);
        fdb_doc_free(rdoc);
    }

    // retrieve check
    for (i=0;i<n;++i){
        // general retrieval
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        fdb_doc_free(rdoc);

        // get from txn1
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn1, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        sprintf(bodybuf, "body%d_txn1", i);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);

        // get from txn2
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn2, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        sprintf(bodybuf, "body%d_txn2", i);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // commit txn2 & retrieve check
    fdb_end_transaction(dbfile_txn2, FDB_COMMIT_NORMAL);
    for (i=0;i<n;++i){
        // general retrieval
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        sprintf(bodybuf, "body%d_txn2", i);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);

        // get from txn1
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn1, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        sprintf(bodybuf, "body%d_txn1", i);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // commit txn1 & retrieve check
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_NORMAL);
    for (i=0;i<n;++i){
        // general retrieval
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        sprintf(bodybuf, "body%d_txn1", i);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // begin new transaction
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    // update doc#5
    i = 5;
    sprintf(keybuf, "key%d", i);
    sprintf(metabuf, "meta%d", i);
    sprintf(bodybuf, "body%d_before_compaction", i);
    fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                            (void*)metabuf, strlen(metabuf),
                            (void*)bodybuf, strlen(bodybuf));
    fdb_set(db_txn1, rdoc);
    fdb_doc_free(rdoc);

    // do compaction
    fdb_compact(dbfile, "mvcc_test2");

    // retrieve doc#5
    // using txn1
    fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
    status = fdb_get(db_txn1, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
    fdb_doc_free(rdoc);

    // general retrieval
    fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
    status = fdb_get(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    sprintf(bodybuf, "body%d_txn1", i);
    TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
    fdb_doc_free(rdoc);

    // commit transaction
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_NORMAL);
    // retrieve check
    for (i=0;i<n;++i){
        // general get
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (i != 5) {
            sprintf(bodybuf, "body%d_txn1", i);
        } else {
            sprintf(bodybuf, "body%d_before_compaction", i);
        }
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // close & re-open db file
    fdb_close(dbfile);
    fdb_open(&dbfile, "mvcc_test2", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "transaction_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // retrieve check again
    for (i=0;i<n;++i){
        // general get
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (i != 5) {
            sprintf(bodybuf, "body%d_txn1", i);
        } else {
            sprintf(bodybuf, "body%d_before_compaction", i);
        }
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // close db file
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_close(dbfile_txn2);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("transaction test");
}